

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O2

ptr<custom_notification_msg> __thiscall
nuraft::custom_notification_msg::deserialize(custom_notification_msg *this,buffer *buf)

{
  byte bVar1;
  void *__src;
  byte *__dest;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ptr<custom_notification_msg> pVar3;
  size_t buf_len;
  buffer_serializer bs;
  size_t local_40;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_38;
  buffer_serializer local_28;
  
  std::make_shared<nuraft::custom_notification_msg>();
  buffer_serializer::buffer_serializer(&local_28,buf,LITTLE);
  buffer_serializer::get_u8(&local_28);
  bVar1 = buffer_serializer::get_u8(&local_28);
  **(uint **)this = (uint)bVar1;
  local_40 = 0;
  __src = buffer_serializer::get_bytes(&local_28,&local_40);
  if (local_40 == 0) {
    local_38._M_ptr = (element_type *)0x0;
    local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 8),
               &local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    buffer::alloc((buffer *)&local_38,local_40);
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 8),
               &local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    __dest = buffer::data_begin(*(buffer **)(*(long *)this + 8));
    memcpy(__dest,__src,local_40);
    _Var2._M_pi = extraout_RDX;
  }
  pVar3.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (ptr<custom_notification_msg>)
         pVar3.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<custom_notification_msg> custom_notification_msg::deserialize(buffer& buf) {
    ptr<custom_notification_msg> ret = cs_new<custom_notification_msg>();

    buffer_serializer bs(buf);
    uint8_t version = bs.get_u8();
    (void)version;
    ret->type_ = static_cast<custom_notification_msg::type>(bs.get_u8());

    size_t buf_len = 0;
    void* ptr = bs.get_bytes(buf_len);

    if (buf_len) {
        ret->ctx_ = buffer::alloc(buf_len);
        memcpy(ret->ctx_->data_begin(), ptr, buf_len);
    } else {
        ret->ctx_ = nullptr;
    }

    return ret;
}